

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O1

void array_suite::run(void)

{
  test_empty();
  test_bool_one();
  test_bool_two();
  test_nested_bool_one();
  fail_missing_begin();
  fail_mismatched_end();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_bool_one();
    test_bool_two();
    test_nested_bool_one();
    fail_missing_begin();
    fail_mismatched_end();
}